

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

D_ParseNode * d_find_in_tree(D_ParseNode *apn,int symbol)

{
  D_ParseNode *pDVar1;
  D_ParseNode *local_40;
  uint local_34;
  uint i;
  D_ParseNode *res;
  PNode *pn;
  int symbol_local;
  D_ParseNode *apn_local;
  
  if (apn == (D_ParseNode *)0x0) {
    local_40 = (D_ParseNode *)0x0;
  }
  else {
    local_40 = apn + -2;
  }
  apn_local = apn;
  if (local_40[2].symbol != symbol) {
    for (local_34 = 0; local_34 < *(uint *)&local_40->end_skip; local_34 = local_34 + 1) {
      pDVar1 = d_find_in_tree((D_ParseNode *)
                              (*(long *)(&local_40->scope->field_0x0 + (ulong)local_34 * 8) + 0x90),
                              symbol);
      if (pDVar1 != (D_ParseNode *)0x0) {
        return pDVar1;
      }
    }
    apn_local = (D_ParseNode *)0x0;
  }
  return apn_local;
}

Assistant:

D_ParseNode *d_find_in_tree(D_ParseNode *apn, int symbol) {
  PNode *pn = D_ParseNode_to_PNode(apn);
  D_ParseNode *res;
  uint i;

  if (pn->parse_node.symbol == symbol) return apn;
  for (i = 0; i < pn->children.n; i++)
    if ((res = d_find_in_tree(&pn->children.v[i]->parse_node, symbol))) return res;
  return NULL;
}